

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_outputParameterTraced_Test::testBody
          (TEST_MockParameterTest_outputParameterTraced_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  char *pcVar4;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  undefined4 local_30 [2];
  int param;
  SimpleString local_20;
  TEST_MockParameterTest_outputParameterTraced_Test *local_10;
  TEST_MockParameterTest_outputParameterTraced_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x23])(pMVar2,1);
  SimpleString::~SimpleString(&local_20);
  local_30[0] = 1;
  SimpleString::SimpleString(&local_40,"");
  pMVar2 = mock(&local_40,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"someFunc");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_50);
  SimpleString::SimpleString(&local_60,"someParameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_60,local_30);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::SimpleString(&local_70,"");
  pMVar2 = mock(&local_70,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_70);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  pcVar4 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"Function name:someFunc someParameter:",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x343);
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_90);
  return;
}

Assistant:

TEST(MockParameterTest, outputParameterTraced)
{
    mock().tracing(true);

    int param = 1;
    mock().actualCall("someFunc").withOutputParameter("someParameter", &param);
    mock().checkExpectations();
    STRCMP_CONTAINS("Function name:someFunc someParameter:", mock().getTraceOutput());

    mock().checkExpectations();
}